

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>
::find_or_prepare_insert_non_soo<google::protobuf::FileDescriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>
          *this,FileDescriptor **key)

{
  ctrl_t *pcVar1;
  FileDescriptor *pFVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  char cVar7;
  slot_type *psVar8;
  ctrl_t *pcVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  __m128i match;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  FindInfo FVar25;
  ctrl_t cVar20;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  
  pcVar9 = *(ctrl_t **)(this + 0x10);
  pFVar2 = *key;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (FileDescriptor *)((long)&hash_internal::MixingHashState::kSeed + (long)pFVar2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pFVar2 + (SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),0) ^
                          SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),8));
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar17 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar12 = uVar17 >> 7 ^ (ulong)pcVar9 >> 0xc;
  auVar18 = ZEXT216(CONCAT11((char)uVar17,(char)uVar17) & 0x7f7f);
  auVar18 = pshuflw(auVar18,auVar18,0);
  uVar16 = 0;
  do {
    uVar12 = uVar12 & uVar3;
    pcVar1 = pcVar9 + uVar12;
    cVar20 = auVar18[0];
    auVar21[0] = -(cVar20 == *pcVar1);
    cVar22 = auVar18[1];
    auVar21[1] = -(cVar22 == pcVar1[1]);
    cVar23 = auVar18[2];
    auVar21[2] = -(cVar23 == pcVar1[2]);
    cVar24 = auVar18[3];
    auVar21[3] = -(cVar24 == pcVar1[3]);
    auVar21[4] = -(cVar20 == pcVar1[4]);
    auVar21[5] = -(cVar22 == pcVar1[5]);
    auVar21[6] = -(cVar23 == pcVar1[6]);
    auVar21[7] = -(cVar24 == pcVar1[7]);
    auVar21[8] = -(cVar20 == pcVar1[8]);
    auVar21[9] = -(cVar22 == pcVar1[9]);
    auVar21[10] = -(cVar23 == pcVar1[10]);
    auVar21[0xb] = -(cVar24 == pcVar1[0xb]);
    auVar21[0xc] = -(cVar20 == pcVar1[0xc]);
    auVar21[0xd] = -(cVar22 == pcVar1[0xd]);
    auVar21[0xe] = -(cVar23 == pcVar1[0xe]);
    auVar21[0xf] = -(cVar24 == pcVar1[0xf]);
    uVar13 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf;
    uVar11 = (uint)uVar13;
    while (uVar13 != 0) {
      uVar4 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar14 = uVar4 + uVar12 & uVar3;
      lVar15 = uVar14 * 0x50;
      if (*(FileDescriptor **)(*(long *)(this + 0x18) + lVar15) == pFVar2) {
        if (pcVar9 == (ctrl_t *)0x0) goto LAB_002ccc06;
        psVar8 = (slot_type *)(*(long *)(this + 0x18) + lVar15);
        pcVar9 = pcVar9 + uVar14;
        bVar10 = false;
        goto LAB_002ccbcb;
      }
      uVar13 = (ushort)(uVar11 - 1) & (ushort)uVar11;
      uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar13);
    }
    auVar19[0] = -(*pcVar1 == kEmpty);
    auVar19[1] = -(pcVar1[1] == kEmpty);
    auVar19[2] = -(pcVar1[2] == kEmpty);
    auVar19[3] = -(pcVar1[3] == kEmpty);
    auVar19[4] = -(pcVar1[4] == kEmpty);
    auVar19[5] = -(pcVar1[5] == kEmpty);
    auVar19[6] = -(pcVar1[6] == kEmpty);
    auVar19[7] = -(pcVar1[7] == kEmpty);
    auVar19[8] = -(pcVar1[8] == kEmpty);
    auVar19[9] = -(pcVar1[9] == kEmpty);
    auVar19[10] = -(pcVar1[10] == kEmpty);
    auVar19[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar19[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar19[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar19[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar19[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar13 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar13 != 0) {
      cVar7 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (uVar3,uVar17,pcVar9);
      if (cVar7 == '\0') {
        uVar11 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar11 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar25.offset = uVar11 + uVar12 & uVar3;
      FVar25.probe_length = uVar16;
      lVar15 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar17,FVar25,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
LAB_002ccc06:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>]"
                     );
      }
      pcVar9 = (ctrl_t *)(*(long *)(this + 0x10) + lVar15);
      psVar8 = (slot_type *)(lVar15 * 0x50 + *(long *)(this + 0x18));
      bVar10 = true;
LAB_002ccbcb:
      (__return_storage_ptr__->first).ctrl_ = pcVar9;
      (__return_storage_ptr__->first).field_1.slot_ = psVar8;
      __return_storage_ptr__->second = bVar10;
      return __return_storage_ptr__;
    }
    uVar12 = uVar12 + uVar16 + 0x10;
    uVar16 = uVar16 + 0x10;
    if (uVar3 < uVar16) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, google::protobuf::compiler::objectivec::FileGenerator::CommonState::MinDepsEntry>>, K = const google::protobuf::FileDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }